

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcPrint.c
# Opt level: O2

void Mvc_CoverPrintBinary(Mvc_Cover_t *pCover)

{
  byte bVar1;
  int __c;
  int iVar;
  ulong uVar2;
  Mvc_Cube_t *pMVar3;
  long lVar4;
  
  pMVar3 = (Mvc_Cube_t *)&pCover->lCubes;
  printf("The cover contains %d cubes (%d bits and %d words)\n",(ulong)(uint)(pCover->lCubes).nItems
         ,(ulong)(uint)pCover->nBits,(ulong)(uint)pCover->nWords);
  do {
    pMVar3 = pMVar3->pNext;
    if (pMVar3 == (Mvc_Cube_t *)0x0) {
      if (pCover->pLits != (int *)0x0) {
        for (lVar4 = 0; lVar4 < pCover->nBits; lVar4 = lVar4 + 1) {
          printf(" %d",(ulong)(uint)pCover->pLits[lVar4]);
        }
        putchar(10);
      }
      puts("End of cover printout");
      return;
    }
    bVar1 = 0;
    for (uVar2 = 0; (int)uVar2 < pCover->nBits / 2; uVar2 = (ulong)((int)uVar2 + 1)) {
      __c = 0x2d;
      switch(pMVar3->pData[uVar2 >> 4] >> (bVar1 & 0x1e) & 3) {
      case 0:
        goto switchD_0037ed5c_caseD_0;
      case 1:
        __c = 0x30;
        break;
      case 2:
        __c = 0x31;
      }
      putchar(__c);
      bVar1 = bVar1 + 2;
    }
switchD_0037ed5c_caseD_0:
    putchar(10);
  } while( true );
}

Assistant:

void Mvc_CoverPrintBinary( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int i;
    // print general statistics
    printf( "The cover contains %d cubes (%d bits and %d words)\n", 
        pCover->lCubes.nItems, pCover->nBits, pCover->nWords );
    // iterate through the cubes
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubePrintBinary( pCover, pCube );

    if ( pCover->pLits )
    {
        for ( i = 0; i < pCover->nBits; i++ )
            printf( " %d", pCover->pLits[i] );
        printf( "\n" ); 
    }
    printf( "End of cover printout\n" ); 
}